

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O1

void __thiscall
btCollisionWorld::convexSweepTest
          (btCollisionWorld *this,btConvexShape *castShape,btTransform *convexFromWorld,
          btTransform *convexToWorld,ConvexResultCallback *resultCallback,
          btScalar allowedCcdPenetration)

{
  btScalar angle;
  btVector3 angVel;
  btVector3 castShapeAabbMax;
  btVector3 castShapeAabbMin;
  btSingleSweepCallback convexCB;
  btTransform convexFromTrans;
  btTransform convexToTrans;
  btQuaternion local_1e8;
  btVector3 local_1d8;
  btVector3 local_1c0;
  btVector3 local_1b0;
  btVector3 local_1a0;
  undefined1 local_190 [4];
  btScalar bStack_18c;
  btScalar bStack_188;
  btScalar abStack_184 [3];
  uint local_178 [2];
  btScalar abStack_170 [46];
  btQuaternion local_b8;
  btTransform local_a8;
  btTransform local_68;
  
  CProfileManager::Start_Profile("convexSweepTest");
  local_a8.m_basis.m_el[0].m_floats._0_8_ =
       *(undefined8 *)(convexFromWorld->m_basis).m_el[0].m_floats;
  local_a8.m_basis.m_el[0].m_floats._8_8_ =
       *(undefined8 *)((convexFromWorld->m_basis).m_el[0].m_floats + 2);
  local_a8.m_basis.m_el[1].m_floats._0_8_ =
       *(undefined8 *)(convexFromWorld->m_basis).m_el[1].m_floats;
  local_a8.m_basis.m_el[1].m_floats._8_8_ =
       *(undefined8 *)((convexFromWorld->m_basis).m_el[1].m_floats + 2);
  local_a8.m_basis.m_el[2].m_floats._0_8_ =
       *(undefined8 *)(convexFromWorld->m_basis).m_el[2].m_floats;
  local_a8.m_basis.m_el[2].m_floats._8_8_ =
       *(undefined8 *)((convexFromWorld->m_basis).m_el[2].m_floats + 2);
  local_a8.m_origin.m_floats._0_8_ = *(undefined8 *)(convexFromWorld->m_origin).m_floats;
  local_a8.m_origin.m_floats._8_8_ = *(undefined8 *)((convexFromWorld->m_origin).m_floats + 2);
  local_68.m_basis.m_el[0].m_floats._0_8_ = *(undefined8 *)(convexToWorld->m_basis).m_el[0].m_floats
  ;
  local_68.m_basis.m_el[0].m_floats._8_8_ =
       *(undefined8 *)((convexToWorld->m_basis).m_el[0].m_floats + 2);
  local_68.m_basis.m_el[1].m_floats._0_8_ = *(undefined8 *)(convexToWorld->m_basis).m_el[1].m_floats
  ;
  local_68.m_basis.m_el[1].m_floats._8_8_ =
       *(undefined8 *)((convexToWorld->m_basis).m_el[1].m_floats + 2);
  local_68.m_basis.m_el[2].m_floats._0_8_ = *(undefined8 *)(convexToWorld->m_basis).m_el[2].m_floats
  ;
  local_68.m_basis.m_el[2].m_floats._8_8_ =
       *(undefined8 *)((convexToWorld->m_basis).m_el[2].m_floats + 2);
  local_68.m_origin.m_floats._0_8_ = *(undefined8 *)(convexToWorld->m_origin).m_floats;
  local_68.m_origin.m_floats._8_8_ = *(undefined8 *)((convexToWorld->m_origin).m_floats + 2);
  btTransformUtil::calculateDiffAxisAngle
            (&local_a8,&local_68,(btVector3 *)local_190,(btScalar *)&local_1e8);
  local_1c0.m_floats[1] = local_1e8.super_btQuadWord.m_floats[0] * bStack_18c;
  local_1c0.m_floats[0] = local_1e8.super_btQuadWord.m_floats[0] * (float)local_190;
  local_1c0.m_floats[2] = local_1e8.super_btQuadWord.m_floats[0] * bStack_188;
  local_1c0.m_floats[3] = 0.0;
  local_1d8.m_floats[0] = 0.0;
  local_1d8.m_floats[1] = 0.0;
  local_1d8.m_floats[2] = 0.0;
  local_1d8.m_floats[3] = 0.0;
  local_190 = (undefined1  [4])0x3f800000;
  bStack_18c = 0.0;
  bStack_188 = 0.0;
  abStack_184[0] = 0.0;
  abStack_184[1] = 0.0;
  abStack_184[2] = 1.0;
  local_178[0] = 0;
  local_178[1] = 0;
  abStack_170[0] = 0.0;
  abStack_170[1] = 0.0;
  abStack_170[2] = 1.0;
  abStack_170[3] = 0.0;
  abStack_170[4] = 0.0;
  abStack_170[5] = 0.0;
  abStack_170[6] = 0.0;
  abStack_170[7] = 0.0;
  btMatrix3x3::getRotation(&local_a8.m_basis,&local_1e8);
  local_b8.super_btQuadWord.m_floats[2] = local_1e8.super_btQuadWord.m_floats[2];
  local_b8.super_btQuadWord.m_floats[3] = local_1e8.super_btQuadWord.m_floats[3];
  btMatrix3x3::setRotation((btMatrix3x3 *)local_190,&local_b8);
  btCollisionShape::calculateTemporalAabb
            (&castShape->super_btCollisionShape,(btTransform *)local_190,&local_1d8,&local_1c0,1.0,
             &local_1a0,&local_1b0);
  btSingleSweepCallback::btSingleSweepCallback
            ((btSingleSweepCallback *)local_190,castShape,convexFromWorld,convexToWorld,this,
             resultCallback,allowedCcdPenetration);
  (*this->m_broadphasePairCache->_vptr_btBroadphaseInterface[6])
            (this->m_broadphasePairCache,&local_a8.m_origin,&local_68.m_origin,local_190,&local_1a0,
             &local_1b0);
  CProfileManager::Stop_Profile();
  return;
}

Assistant:

void	btCollisionWorld::convexSweepTest(const btConvexShape* castShape, const btTransform& convexFromWorld, const btTransform& convexToWorld, ConvexResultCallback& resultCallback, btScalar allowedCcdPenetration) const
{

	BT_PROFILE("convexSweepTest");
	/// use the broadphase to accelerate the search for objects, based on their aabb
	/// and for each object with ray-aabb overlap, perform an exact ray test
	/// unfortunately the implementation for rayTest and convexSweepTest duplicated, albeit practically identical



	btTransform	convexFromTrans,convexToTrans;
	convexFromTrans = convexFromWorld;
	convexToTrans = convexToWorld;
	btVector3 castShapeAabbMin, castShapeAabbMax;
	/* Compute AABB that encompasses angular movement */
	{
		btVector3 linVel, angVel;
		btTransformUtil::calculateVelocity (convexFromTrans, convexToTrans, 1.0f, linVel, angVel);
		btVector3 zeroLinVel;
		zeroLinVel.setValue(0,0,0);
		btTransform R;
		R.setIdentity ();
		R.setRotation (convexFromTrans.getRotation());
		castShape->calculateTemporalAabb (R, zeroLinVel, angVel, 1.0f, castShapeAabbMin, castShapeAabbMax);
	}

#ifndef USE_BRUTEFORCE_RAYBROADPHASE

	btSingleSweepCallback	convexCB(castShape,convexFromWorld,convexToWorld,this,resultCallback,allowedCcdPenetration);

	m_broadphasePairCache->rayTest(convexFromTrans.getOrigin(),convexToTrans.getOrigin(),convexCB,castShapeAabbMin,castShapeAabbMax);

#else
	/// go over all objects, and if the ray intersects their aabb + cast shape aabb,
	// do a ray-shape query using convexCaster (CCD)
	int i;
	for (i=0;i<m_collisionObjects.size();i++)
	{
		btCollisionObject*	collisionObject= m_collisionObjects[i];
		//only perform raycast if filterMask matches
		if(resultCallback.needsCollision(collisionObject->getBroadphaseHandle())) {
			//RigidcollisionObject* collisionObject = ctrl->GetRigidcollisionObject();
			btVector3 collisionObjectAabbMin,collisionObjectAabbMax;
			collisionObject->getCollisionShape()->getAabb(collisionObject->getWorldTransform(),collisionObjectAabbMin,collisionObjectAabbMax);
			AabbExpand (collisionObjectAabbMin, collisionObjectAabbMax, castShapeAabbMin, castShapeAabbMax);
			btScalar hitLambda = btScalar(1.); //could use resultCallback.m_closestHitFraction, but needs testing
			btVector3 hitNormal;
			if (btRayAabb(convexFromWorld.getOrigin(),convexToWorld.getOrigin(),collisionObjectAabbMin,collisionObjectAabbMax,hitLambda,hitNormal))
			{
				objectQuerySingle(castShape, convexFromTrans,convexToTrans,
					collisionObject,
					collisionObject->getCollisionShape(),
					collisionObject->getWorldTransform(),
					resultCallback,
					allowedCcdPenetration);
			}
		}
	}
#endif //USE_BRUTEFORCE_RAYBROADPHASE
}